

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManCollectCircle(Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,int nFanMax)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  int local_38;
  int local_34;
  int k;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pObj;
  int nFanMax_local;
  Vec_Ptr_t *vNext_local;
  Vec_Ptr_t *vStart_local;
  
  Vec_PtrClear(vNext);
  for (local_34 = 0; iVar1 = Vec_PtrSize(vStart), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar2 = Vec_PtrEntry(vStart,local_34);
    local_38 = 0;
    while( true ) {
      bVar3 = false;
      if (local_38 < *(int *)((long)pvVar2 + 0x3c)) {
        _k = *(Nwk_Obj_t **)(*(long *)((long)pvVar2 + 0x48) + (long)local_38 * 8);
        bVar3 = _k != (Nwk_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Nwk_ObjIsNode(_k);
      if ((iVar1 != 0) && (iVar1 = Nwk_ObjIsTravIdCurrent(_k), iVar1 == 0)) {
        Nwk_ObjSetTravIdCurrent(_k);
        Vec_PtrPush(vNext,_k);
      }
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      bVar3 = false;
      if (local_38 < *(int *)((long)pvVar2 + 0x40)) {
        _k = *(Nwk_Obj_t **)
              (*(long *)((long)pvVar2 + 0x48) + (long)(*(int *)((long)pvVar2 + 0x3c) + local_38) * 8
              );
        bVar3 = _k != (Nwk_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Nwk_ObjIsNode(_k);
      if ((iVar1 != 0) && (iVar1 = Nwk_ObjIsTravIdCurrent(_k), iVar1 == 0)) {
        Nwk_ObjSetTravIdCurrent(_k);
        iVar1 = Nwk_ObjFanoutNum(_k);
        if (iVar1 <= nFanMax) {
          Vec_PtrPush(vNext,_k);
        }
      }
      local_38 = local_38 + 1;
    }
  }
  return;
}

Assistant:

void Nwk_ManCollectCircle( Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, int nFanMax )
{
    Nwk_Obj_t * pObj, * pNext;
    int i, k;
    Vec_PtrClear( vNext );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vStart, pObj, i )
    {
        Nwk_ObjForEachFanin( pObj, pNext, k )
        {
            if ( !Nwk_ObjIsNode(pNext) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pNext ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pNext );
            Vec_PtrPush( vNext, pNext );
        }
        Nwk_ObjForEachFanout( pObj, pNext, k )
        {
            if ( !Nwk_ObjIsNode(pNext) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pNext ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pNext );
            if ( Nwk_ObjFanoutNum(pNext) > nFanMax )
                continue;
            Vec_PtrPush( vNext, pNext );
        }
    }
}